

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::RawHashSetLayout::RawHashSetLayout
          (RawHashSetLayout *this,size_t capacity,size_t slot_align,bool has_infoz)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  bool has_infoz_local;
  size_t slot_align_local;
  size_t capacity_local;
  RawHashSetLayout *this_local;
  
  this->capacity_ = capacity;
  sVar2 = ControlOffset(has_infoz);
  this->control_offset_ = sVar2;
  sVar2 = this->control_offset_;
  sVar3 = NumControlBytes(capacity);
  this->generation_offset_ = sVar2 + sVar3;
  sVar2 = this->generation_offset_;
  sVar3 = NumGenerationBytes();
  this->slot_offset_ = (sVar2 + sVar3 + slot_align) - 1 & (slot_align ^ 0xffffffffffffffff) + 1;
  bVar1 = IsValidCapacity(capacity);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x4a6,
                  "absl::container_internal::RawHashSetLayout::RawHashSetLayout(size_t, size_t, bool)"
                 );
  }
  return;
}

Assistant:

explicit RawHashSetLayout(size_t capacity, size_t slot_align, bool has_infoz)
      : capacity_(capacity),
        control_offset_(ControlOffset(has_infoz)),
        generation_offset_(control_offset_ + NumControlBytes(capacity)),
        slot_offset_(
            (generation_offset_ + NumGenerationBytes() + slot_align - 1) &
            (~slot_align + 1)) {
    assert(IsValidCapacity(capacity));
  }